

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXExportProperty::FBXExportProperty(FBXExportProperty *this,string *s,bool raw)

{
  size_t i;
  ulong uVar1;
  allocator_type local_11;
  
  this->type = raw ^ 0x53;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->data,s->_M_string_length,&local_11);
  for (uVar1 = 0; uVar1 < s->_M_string_length; uVar1 = uVar1 + 1) {
    (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar1] = (s->_M_dataplus)._M_p[uVar1];
  }
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(const std::string& s, bool raw)
: type(raw ? 'R' : 'S')
, data(s.size()) {
    for (size_t i = 0; i < s.size(); ++i) {
        data[i] = uint8_t(s[i]);
    }
}